

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O2

void fetch_linear_gradient(uint32_t *buffer,Operator *op,VSpanData *data,int y,int x,int length)

{
  VGradientData *grad;
  uint32_t *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint32_t uVar8;
  int fixed_pos;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  grad = &data->mGradient;
  fVar9 = (op->field_4).linear.l;
  fVar14 = 0.0;
  fVar11 = 0.0;
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    fVar14 = (float)y + 0.5;
    fVar10 = (float)x + 0.5;
    uVar2 = data->m21;
    uVar5 = data->m22;
    uVar3 = data->m11;
    uVar6 = data->m12;
    uVar4 = data->dx;
    uVar7 = data->dy;
    fVar12 = (float)uVar4 + fVar14 * (float)uVar2 + fVar10 * (float)uVar3;
    fVar13 = (float)uVar7 + fVar14 * (float)uVar5 + fVar10 * (float)uVar6;
    fVar9 = data->m13;
    fVar11 = data->m23;
    if ((fVar9 != 0.0) || (((NAN(fVar9) || (fVar11 != 0.0)) || (NAN(fVar11))))) {
      puVar1 = buffer + length;
      fVar11 = fVar11 * fVar14 + fVar10 * fVar9 + data->m33;
      for (; buffer < puVar1; buffer = buffer + 1) {
        uVar8 = gradientPixel(grad,(fVar12 / fVar11) * (op->field_4).linear.dx +
                                   (fVar13 / fVar11) * (op->field_4).linear.dy +
                                   (op->field_4).linear.off);
        *buffer = uVar8;
        fVar12 = fVar12 + (float)uVar3;
        fVar13 = fVar13 + (float)uVar6;
        fVar11 = fVar11 + fVar9;
        fVar11 = (float)((uint)fVar11 & -(uint)(fVar11 != 0.0) |
                        ~-(uint)(fVar11 != 0.0) & (uint)(fVar9 + fVar11));
      }
      return;
    }
    fVar9 = (op->field_4).linear.dx;
    fVar14 = (op->field_4).linear.dy;
    fVar11 = (fVar13 * fVar14 + fVar9 * fVar12 + (op->field_4).linear.off) * 1023.0;
    fVar14 = ((float)uVar6 * fVar14 + fVar9 * (float)uVar3) * 1023.0;
  }
  if (1e-05 <= ABS(fVar14)) {
    puVar1 = buffer + length;
    fVar9 = (float)length * fVar14 + fVar11;
    if ((4194303.0 <= fVar9) || (fVar9 <= -4194304.0)) {
      for (; buffer < puVar1; buffer = buffer + 1) {
        uVar8 = gradientPixel(grad,fVar11 * 0.0009765625);
        *buffer = uVar8;
        fVar11 = fVar11 + fVar14;
      }
    }
    else {
      fixed_pos = (int)(fVar11 * 256.0);
      for (; buffer < puVar1; buffer = buffer + 1) {
        uVar8 = gradientPixelFixed(grad,fixed_pos);
        *buffer = uVar8;
        fixed_pos = fixed_pos + (int)(fVar14 * 256.0);
      }
    }
    return;
  }
  uVar8 = gradientPixelFixed(grad,(int)(fVar11 * 256.0));
  memfill32(buffer,uVar8,length);
  return;
}

Assistant:

void fetch_linear_gradient(uint32_t *buffer, const Operator *op,
                           const VSpanData *data, int y, int x, int length)
{
    float                t, inc;
    const VGradientData *gradient = &data->mGradient;

    bool  affine = true;
    float rx = 0, ry = 0;
    if (op->linear.l == 0) {
        t = inc = 0;
    } else {
        rx = data->m21 * (y + float(0.5)) + data->m11 * (x + float(0.5)) +
             data->dx;
        ry = data->m22 * (y + float(0.5)) + data->m12 * (x + float(0.5)) +
             data->dy;
        t = op->linear.dx * rx + op->linear.dy * ry + op->linear.off;
        inc = op->linear.dx * data->m11 + op->linear.dy * data->m12;
        affine = !data->m13 && !data->m23;

        if (affine) {
            t *= (VGradient::colorTableSize - 1);
            inc *= (VGradient::colorTableSize - 1);
        }
    }

    const uint32_t *end = buffer + length;
    if (affine) {
        if (inc > float(-1e-5) && inc < float(1e-5)) {
            memfill32(buffer, gradientPixelFixed(gradient, int(t * FIXPT_SIZE)),
                      length);
        } else {
            if (t + inc * length < float(INT_MAX >> (FIXPT_BITS + 1)) &&
                t + inc * length > float(INT_MIN >> (FIXPT_BITS + 1))) {
                // we can use fixed point math
                int t_fixed = int(t * FIXPT_SIZE);
                int inc_fixed = int(inc * FIXPT_SIZE);
                while (buffer < end) {
                    *buffer = gradientPixelFixed(gradient, t_fixed);
                    t_fixed += inc_fixed;
                    ++buffer;
                }
            } else {
                // we have to fall back to float math
                while (buffer < end) {
                    *buffer =
                        gradientPixel(gradient, t / VGradient::colorTableSize);
                    t += inc;
                    ++buffer;
                }
            }
        }
    } else {  // fall back to float math here as well
        float rw = data->m23 * (y + float(0.5)) + data->m13 * (x + float(0.5)) +
                   data->m33;
        while (buffer < end) {
            float xt = rx / rw;
            float yt = ry / rw;
            t = (op->linear.dx * xt + op->linear.dy * yt) + op->linear.off;

            *buffer = gradientPixel(gradient, t);
            rx += data->m11;
            ry += data->m12;
            rw += data->m13;
            if (!rw) {
                rw += data->m13;
            }
            ++buffer;
        }
    }
}